

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  MouseButton MVar4;
  MouseButtons MVar5;
  KeyboardModifiers KVar6;
  MouseEventSource MVar7;
  uint uVar8;
  QGraphicsProxyWidget *pQVar9;
  QGraphicsProxyWidget *pQVar10;
  QWidget *this_00;
  QGraphicsItem *this_01;
  QWidget *pQVar11;
  QPoint leave;
  QWidget *receiver_00;
  uint uVar13;
  QEvent *in_RSI;
  QGraphicsProxyWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidget *q_1;
  Type type;
  QGraphicsProxyWidget *q;
  QCursor widgetsCursor;
  QWidget *embeddedMouseGrabberPtr;
  QMouseEvent mouseEvent;
  QPointer<QWidget> receiver;
  QPointer<QWidget> alienWidget;
  QPointF pos;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  QWidget *in_stack_fffffffffffffd90;
  QGraphicsProxyWidgetPrivate *in_stack_fffffffffffffd98;
  QWidget *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  QWidget *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  QPointer<QWidget> *lastMouseReceiver;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  bool bVar15;
  QWidget *in_stack_fffffffffffffe20;
  QMouseEvent *in_stack_fffffffffffffe28;
  Type local_1a0;
  QCursor local_180;
  QCursor in_stack_fffffffffffffe88;
  QWidget *in_stack_fffffffffffffe90;
  QWidget *in_stack_fffffffffffffe98;
  undefined1 local_148 [36];
  QFlagsStorageHelper<Qt::MouseButton,_4> local_124;
  QWidget *local_120;
  undefined1 local_118 [24];
  QPoint local_100;
  QPoint local_f8;
  undefined1 local_f0 [16];
  QPoint local_e0;
  QPoint local_d8;
  undefined1 local_d0 [8];
  QWidget *in_stack_ffffffffffffff38;
  QMouseEvent local_c0 [80];
  QPointF local_70;
  QPoint local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  QPoint local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QPointF local_20;
  long local_10;
  undefined2 uVar12;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (QEvent *)0x0) &&
     (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b846c), bVar1)) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b8486);
    bVar1 = QWidget::isVisible((QWidget *)0x9b848e);
    if (bVar1) {
      pQVar9 = q_func(in_RDI);
      local_20.yp = -NAN;
      local_20.xp = -NAN;
      local_20 = QGraphicsSceneMouseEvent::pos
                           ((QGraphicsSceneMouseEvent *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b851b);
      local_38 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffd90);
      QWidget::childAt((QWidget *)in_stack_fffffffffffffd98,(QPoint *)in_stack_fffffffffffffd90);
      QPointer<QWidget>::QPointer<void>
                ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (QWidget *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8588);
      QPointer<QWidget>::QPointer
                ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
      ;
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b85d8);
      pQVar10 = QWidgetPrivate::nearestGraphicsProxyWidget
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
      ;
      if (pQVar10 == pQVar9) {
        local_1a0 = None;
        TVar3 = QEvent::type(in_RSI);
        receiver_00 = (QWidget *)(ulong)(TVar3 - GraphicsSceneMouseMove);
        switch(receiver_00) {
        case (QWidget *)0x0:
          local_1a0 = MouseMove;
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8769);
          if (bVar1) {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          break;
        case (QWidget *)0x1:
          local_1a0 = MouseButtonPress;
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8662);
          if (bVar1) {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          else {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          break;
        case (QWidget *)0x2:
          local_1a0 = MouseButtonRelease;
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b86c4);
          if (bVar1) {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          break;
        case (QWidget *)0x3:
          local_1a0 = MouseButtonDblClick;
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b870a);
          if (bVar1) {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          else {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
        }
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b87a3);
        if (!bVar1) {
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b87bf);
          if (bVar1) {
            in_stack_fffffffffffffe28 = (QMouseEvent *)&in_RDI->embeddedMouseGrabber;
          }
          else {
            in_stack_fffffffffffffe28 = (QMouseEvent *)&local_48;
          }
          in_stack_fffffffffffffe20 =
               ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b87fc);
          local_60 = QGraphicsSceneMouseEvent::screenPos
                               ((QGraphicsSceneMouseEvent *)
                                CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
          QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                           (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          QApplicationPrivate::dispatchEnterLeave
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (QPointF *)in_stack_fffffffffffffe88.d);
          QPointer<QWidget>::operator=
                    ((QPointer<QWidget> *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (QPointer<QWidget> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        }
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8870);
        local_70 = mapToReceiver(in_stack_fffffffffffffd98,(QPointF *)in_stack_fffffffffffffd90,
                                 in_stack_fffffffffffffdb8);
        local_20 = local_70;
        memset(local_c0,0xaa,0x50);
        this_00 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b88e9);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b88fb);
        QWidget::topLevelWidget((QWidget *)0x9b8903);
        local_e0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffd90);
        local_d8 = QWidget::mapTo(in_stack_fffffffffffffda0,(QWidget *)in_stack_fffffffffffffd98,
                                  (QPoint *)in_stack_fffffffffffffd90);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b895e);
        local_100 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffd90);
        local_f8 = QWidget::mapToGlobal
                             (in_stack_fffffffffffffd90,
                              (QPoint *)
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        MVar4 = QGraphicsSceneMouseEvent::button
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        MVar5 = QGraphicsSceneMouseEvent::buttons
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        KVar6 = QGraphicsSceneMouseEvent::modifiers
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        MVar7 = QGraphicsSceneMouseEvent::source
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        QString::QString((QString *)0x9b89fe);
        this_01 = (QGraphicsItem *)QPointingDevice::primaryPointingDevice((QString *)local_118);
        QMouseEvent::QMouseEvent
                  (local_c0,local_1a0,(QPointF *)&local_20,(QPointF *)local_d0,(QPointF *)local_f0,
                   MVar4,(QFlags_conflict1 *)
                         CONCAT44(in_stack_fffffffffffffd7c,
                                  MVar5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                  super_QFlagsStorage<Qt::MouseButton>.i),
                   (QFlags_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffd84,
                            KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i),MVar7,
                   (QPointingDevice *)this_01);
        QString::~QString((QString *)0x9b8a6c);
        QGraphicsSceneEvent::timestamp((QGraphicsSceneEvent *)0x9b8a79);
        QPointerEvent::setTimestamp((ulonglong)local_c0);
        local_120 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8a9d);
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8ab2);
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8ac7);
        pQVar11 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8ae3);
        uVar12 = (undefined2)((ulong)pQVar11 >> 0x30);
        lastMouseReceiver = &in_RDI->lastWidgetUnderMouse;
        bVar1 = QEvent::spontaneous(in_RSI);
        uVar13 = (uint)bVar1;
        uVar14 = 0;
        QApplicationPrivate::sendMouseEvent
                  (receiver_00,in_stack_fffffffffffffe28,in_stack_ffffffffffffff38,
                   in_stack_fffffffffffffe20,
                   (QWidget **)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   lastMouseReceiver,SUB21((ushort)uVar12 >> 8,0),SUB21(uVar12,0));
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                   (QWidget *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8b88);
        bVar15 = false;
        if ((bVar1) && (bVar15 = false, local_1a0 == MouseButtonRelease)) {
          local_124.super_QFlagsStorage<Qt::MouseButton>.i =
               (QFlagsStorage<Qt::MouseButton>)
               QGraphicsSceneMouseEvent::buttons
                         ((QGraphicsSceneMouseEvent *)CONCAT44(in_stack_fffffffffffffd84,uVar14));
          bVar15 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_124);
        }
        if (bVar15 != false) {
          q_func(in_RDI);
          QGraphicsWidget::rect((QGraphicsWidget *)in_stack_fffffffffffffd98);
          QGraphicsSceneMouseEvent::pos
                    ((QGraphicsSceneMouseEvent *)CONCAT44(in_stack_fffffffffffffd8c,MVar7));
          uVar8 = QRectF::contains((QPointF *)local_148);
          in_stack_fffffffffffffdcf = false;
          if ((uVar8 & 1) != 0) {
            in_stack_fffffffffffffdcf = QGraphicsItem::acceptHoverEvents((QGraphicsItem *)0x9b8c63);
          }
          if ((bool)in_stack_fffffffffffffdcf == false) {
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                       (QWidget *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
          }
          else {
            ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8c7e);
            QPointer<QWidget>::operator=
                      ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                       (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
          }
          ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8ced);
          ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b8d06);
          leave = QGraphicsSceneMouseEvent::screenPos
                            ((QGraphicsSceneMouseEvent *)CONCAT44(in_stack_fffffffffffffd84,uVar14))
          ;
          QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                           (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
          QApplicationPrivate::dispatchEnterLeave
                    (in_stack_fffffffffffffe98,(QWidget *)leave,
                     (QPointF *)in_stack_fffffffffffffe88.d);
          QPointer<QWidget>::operator=
                    ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                     (QWidget *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8d78);
          if (!bVar1) {
            QGraphicsItem::unsetCursor
                      ((QGraphicsItem *)
                       CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          }
        }
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b8da3);
        if (bVar1) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b8dcf);
          QWidget::cursor((QWidget *)in_stack_fffffffffffffd98);
          QGraphicsItem::cursor(this_01);
          bVar2 = ::operator!=((QCursor *)CONCAT44(in_stack_fffffffffffffd84,uVar14),
                               (QCursor *)CONCAT44(in_stack_fffffffffffffd7c,uVar13));
          QCursor::~QCursor(&local_180);
          if ((bVar2 & 1) != 0) {
            QGraphicsItem::setCursor
                      ((QGraphicsItem *)this_00,
                       (QCursor *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
          }
          QCursor::~QCursor((QCursor *)&stack0xfffffffffffffe88);
        }
        bVar1 = QEvent::isAccepted((QEvent *)local_c0);
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
        QMouseEvent::~QMouseEvent(local_c0);
      }
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9b8ea3);
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9b8eb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneMouseEvent *event)
{
    if (!event || !widget || !widget->isVisible())
        return;
    Q_Q(QGraphicsProxyWidget);

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : widget;

    if (QWidgetPrivate::nearestGraphicsProxyWidget(receiver) != q)
        return; //another proxywidget will handle the events

    // Translate QGraphicsSceneMouse events to QMouseEvents.
    QEvent::Type type = QEvent::None;
    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
        type = QEvent::MouseButtonPress;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseRelease:
        type = QEvent::MouseButtonRelease;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        type = QEvent::MouseButtonDblClick;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseMove:
        type = QEvent::MouseMove;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    default:
        Q_ASSERT_X(false, "QGraphicsProxyWidget", "internal error");
        break;
    }

    if (!lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(embeddedMouseGrabber ? embeddedMouseGrabber : receiver, nullptr, event->screenPos());
        lastWidgetUnderMouse = receiver;
    }

    // Map event position from us to the receiver
    pos = mapToReceiver(pos, receiver);

    // Send mouse event.
    QMouseEvent mouseEvent(type, pos, receiver->mapTo(receiver->topLevelWidget(), pos.toPoint()),
                           receiver->mapToGlobal(pos.toPoint()),
                           event->button(), event->buttons(), event->modifiers(), event->source());
    mouseEvent.setTimestamp(event->timestamp());

    QWidget *embeddedMouseGrabberPtr = (QWidget *)embeddedMouseGrabber;
    QApplicationPrivate::sendMouseEvent(receiver, &mouseEvent, alienWidget, widget,
                                        &embeddedMouseGrabberPtr, lastWidgetUnderMouse, event->spontaneous());
    embeddedMouseGrabber = embeddedMouseGrabberPtr;

    // Handle enter/leave events when last button is released from mouse
    // grabber child widget.
    if (embeddedMouseGrabber && type == QEvent::MouseButtonRelease && !event->buttons()) {
        Q_Q(QGraphicsProxyWidget);
        if (q->rect().contains(event->pos()) && q->acceptHoverEvents())
            lastWidgetUnderMouse = alienWidget ? alienWidget : widget;
        else // released on the frame our outside the item, or doesn't accept hover events.
            lastWidgetUnderMouse = nullptr;

        QApplicationPrivate::dispatchEnterLeave(lastWidgetUnderMouse, embeddedMouseGrabber, event->screenPos());
        embeddedMouseGrabber = nullptr;

#ifndef QT_NO_CURSOR
        // ### Restore the cursor, don't override it.
        if (!lastWidgetUnderMouse)
            q->unsetCursor();
#endif
    }

#ifndef QT_NO_CURSOR
    // Keep cursor in sync
    if (lastWidgetUnderMouse) {
        QCursor widgetsCursor = lastWidgetUnderMouse->cursor();
        if (q->cursor() != widgetsCursor)
            q->setCursor(widgetsCursor);
    }
#endif

    event->setAccepted(mouseEvent.isAccepted());
}